

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1d96e::OpenGLGraphicsPlugin::InitializeDevice
          (OpenGLGraphicsPlugin *this,XrInstance instance,XrSystemId systemId)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  _Bool _Var4;
  XrResult res;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLint GVar8;
  char *sourceLocation;
  char *originator;
  PFN_xrGetOpenGLGraphicsRequirementsKHR pfnGetOpenGLGraphicsRequirementsKHR;
  GLint minor;
  GLint major;
  ksDriverInstance driverInstance;
  GLsizei length;
  GLint r;
  string local_10f8;
  string local_10d8;
  string local_10b8;
  XrGraphicsRequirementsOpenGLKHR graphicsRequirements;
  ksGpuQueueInfo queueInfo;
  GLchar msg [4096];
  
  res = xrGetInstanceProcAddr(instance,"xrGetOpenGLGraphicsRequirementsKHR");
  if (res < XR_SUCCESS) {
    originator = 
    "xrGetInstanceProcAddr(instance, \"xrGetOpenGLGraphicsRequirementsKHR\", reinterpret_cast<PFN_xrVoidFunction*>(&pfnGetOpenGLGraphicsRequirementsKHR))"
    ;
    sourceLocation =
         "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:98"
    ;
  }
  else {
    graphicsRequirements.minApiVersionSupported = 0;
    graphicsRequirements.maxApiVersionSupported = 0;
    graphicsRequirements.type = XR_TYPE_GRAPHICS_REQUIREMENTS_OPENGL_KHR;
    graphicsRequirements._4_4_ = 0;
    graphicsRequirements.next._0_4_ = 0;
    graphicsRequirements.next._4_4_ = 0;
    res = (*(code *)0x0)(instance,systemId);
    if (XR_ERROR_VALIDATION_FAILURE < res) {
      driverInstance.placeholder = 0;
      queueInfo.queuePriorities[10] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[0xb] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[0xc] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[0xd] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[6] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[7] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[8] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[9] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[2] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[3] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[4] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[5] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queueCount = 0;
      queueInfo.queueProperties = 0;
      queueInfo.queuePriorities[0] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[1] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[0xe] = KS_GPU_QUEUE_PRIORITY_LOW;
      queueInfo.queuePriorities[0xf] = KS_GPU_QUEUE_PRIORITY_LOW;
      _Var4 = ksGpuWindow_Create(&this->window,&driverInstance,&queueInfo,0,
                                 KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8,
                                 KS_GPU_SURFACE_DEPTH_FORMAT_D24,KS_GPU_SAMPLE_COUNT_1,0x280,0x1e0,
                                 false);
      if (!_Var4) {
        local_10d8._M_dataplus._M_p = (pointer)&local_10d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_10d8,"Unable to create GL context","");
        Throw(&local_10d8,(char *)0x0,
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:110"
             );
      }
      major = 0;
      minor = 0;
      glGetIntegerv(0x821b,&major);
      glGetIntegerv(0x821c,&minor);
      if (graphicsRequirements.minApiVersionSupported <=
          ((ulong)(ushort)minor << 0x20 | (ulong)(uint)major << 0x30)) {
        (this->m_graphicsBinding).xDisplay = (this->window).context.xDisplay;
        (this->m_graphicsBinding).visualid = (this->window).context.visualid;
        (this->m_graphicsBinding).glxFBConfig = (this->window).context.glxFBConfig;
        uVar1 = *(undefined4 *)((long)&(this->window).context.glxDrawable + 4);
        uVar2 = *(undefined4 *)&(this->window).context.glxContext;
        uVar3 = *(undefined4 *)((long)&(this->window).context.glxContext + 4);
        *(int *)&(this->m_graphicsBinding).glxDrawable = (int)(this->window).context.glxDrawable;
        *(undefined4 *)((long)&(this->m_graphicsBinding).glxDrawable + 4) = uVar1;
        *(undefined4 *)&(this->m_graphicsBinding).glxContext = uVar2;
        *(undefined4 *)((long)&(this->m_graphicsBinding).glxContext + 4) = uVar3;
        glEnable(0x92e0);
        (*glDebugMessageCallback)(InitializeDevice::anon_class_1_0_00000001::__invoke,this);
        (*glGenFramebuffers)(1,&this->m_swapchainFramebuffer);
        GVar5 = (*glCreateShader)(0x8b31);
        GVar7 = 1;
        (*glShaderSource)(GVar5,1,&(anonymous_namespace)::VertexShaderGlsl,(GLint *)0x0);
        (*glCompileShader)(GVar5);
        CheckShader((OpenGLGraphicsPlugin *)(ulong)GVar5,GVar7);
        GVar6 = (*glCreateShader)(0x8b30);
        GVar7 = 1;
        (*glShaderSource)(GVar6,1,&(anonymous_namespace)::FragmentShaderGlsl,(GLint *)0x0);
        (*glCompileShader)(GVar6);
        CheckShader((OpenGLGraphicsPlugin *)(ulong)GVar6,GVar7);
        GVar7 = (*glCreateProgram)();
        this->m_program = GVar7;
        (*glAttachShader)(GVar7,GVar5);
        (*glAttachShader)(this->m_program,GVar6);
        (*glLinkProgram)(this->m_program);
        GVar7 = this->m_program;
        r = 0;
        (*glGetProgramiv)(GVar7,0x8b82,&r);
        if (r != 0) {
          (*glDeleteShader)(GVar5);
          (*glDeleteShader)(GVar6);
          GVar8 = (*glGetUniformLocation)(this->m_program,"ModelViewProjection");
          this->m_modelViewProjectionUniformLocation = GVar8;
          GVar8 = (*glGetAttribLocation)(this->m_program,"VertexPos");
          this->m_vertexAttribCoords = GVar8;
          GVar8 = (*glGetAttribLocation)(this->m_program,"VertexColor");
          this->m_vertexAttribColor = GVar8;
          (*glGenBuffers)(1,&this->m_cubeVertexBuffer);
          (*glBindBuffer)(0x8892,this->m_cubeVertexBuffer);
          (*glBufferData)(0x8892,0x360,Geometry::c_cubeVertices,0x88e4);
          (*glGenBuffers)(1,&this->m_cubeIndexBuffer);
          (*glBindBuffer)(0x8893,this->m_cubeIndexBuffer);
          (*glBufferData)(0x8893,0x48,Geometry::c_cubeIndices,0x88e4);
          (*glGenVertexArrays)(1,&this->m_vao);
          (*glBindVertexArray)(this->m_vao);
          (*glEnableVertexAttribArray)(this->m_vertexAttribCoords);
          (*glEnableVertexAttribArray)(this->m_vertexAttribColor);
          (*glBindBuffer)(0x8892,this->m_cubeVertexBuffer);
          (*glBindBuffer)(0x8893,this->m_cubeIndexBuffer);
          (*glVertexAttribPointer)(this->m_vertexAttribCoords,3,0x1406,'\0',0x18,(void *)0x0);
          (*glVertexAttribPointer)(this->m_vertexAttribColor,3,0x1406,'\0',0x18,(void *)0xc);
          return;
        }
        memset(msg,0,0x1000);
        (*glGetProgramInfoLog)(GVar7,0x1000,&length,msg);
        Fmt_abi_cxx11_(&local_10b8,"Link program failed: %s",msg);
        Throw(&local_10b8,(char *)0x0,
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:227"
             );
      }
      local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_10f8,
                 "Runtime does not support desired Graphics API and/or version","");
      Throw(&local_10f8,(char *)0x0,
            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:120"
           );
    }
    originator = "pfnGetOpenGLGraphicsRequirementsKHR(instance, systemId, &graphicsRequirements)";
    sourceLocation =
         "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:101"
    ;
  }
  ThrowXrResult(res,originator,sourceLocation);
}

Assistant:

void InitializeDevice(XrInstance instance, XrSystemId systemId) override {
        // Extension function must be loaded by name
        PFN_xrGetOpenGLGraphicsRequirementsKHR pfnGetOpenGLGraphicsRequirementsKHR = nullptr;
        CHECK_XRCMD(xrGetInstanceProcAddr(instance, "xrGetOpenGLGraphicsRequirementsKHR",
                                          reinterpret_cast<PFN_xrVoidFunction*>(&pfnGetOpenGLGraphicsRequirementsKHR)));

        XrGraphicsRequirementsOpenGLKHR graphicsRequirements{XR_TYPE_GRAPHICS_REQUIREMENTS_OPENGL_KHR};
        CHECK_XRCMD(pfnGetOpenGLGraphicsRequirementsKHR(instance, systemId, &graphicsRequirements));

        // Initialize the gl extensions. Note we have to open a window.
        ksDriverInstance driverInstance{};
        ksGpuQueueInfo queueInfo{};
        ksGpuSurfaceColorFormat colorFormat{KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8};
        ksGpuSurfaceDepthFormat depthFormat{KS_GPU_SURFACE_DEPTH_FORMAT_D24};
        ksGpuSampleCount sampleCount{KS_GPU_SAMPLE_COUNT_1};
        if (!ksGpuWindow_Create(&window, &driverInstance, &queueInfo, 0, colorFormat, depthFormat, sampleCount, 640, 480, false)) {
            THROW("Unable to create GL context");
        }

        GLint major = 0;
        GLint minor = 0;
        glGetIntegerv(GL_MAJOR_VERSION, &major);
        glGetIntegerv(GL_MINOR_VERSION, &minor);

        const XrVersion desiredApiVersion = XR_MAKE_VERSION(major, minor, 0);
        if (graphicsRequirements.minApiVersionSupported > desiredApiVersion) {
            THROW("Runtime does not support desired Graphics API and/or version");
        }

#ifdef XR_USE_PLATFORM_WIN32
        m_graphicsBinding.hDC = window.context.hDC;
        m_graphicsBinding.hGLRC = window.context.hGLRC;
#elif defined(XR_USE_PLATFORM_XLIB)
        m_graphicsBinding.xDisplay = window.context.xDisplay;
        m_graphicsBinding.visualid = window.context.visualid;
        m_graphicsBinding.glxFBConfig = window.context.glxFBConfig;
        m_graphicsBinding.glxDrawable = window.context.glxDrawable;
        m_graphicsBinding.glxContext = window.context.glxContext;
#elif defined(XR_USE_PLATFORM_XCB)
        // TODO: Still missing the platform adapter, and some items to make this usable.
        m_graphicsBinding.connection = window.connection;
        // m_graphicsBinding.screenNumber = window.context.screenNumber;
        // m_graphicsBinding.fbconfigid = window.context.fbconfigid;
        m_graphicsBinding.visualid = window.context.visualid;
        m_graphicsBinding.glxDrawable = window.context.glxDrawable;
        // m_graphicsBinding.glxContext = window.context.glxContext;
#elif defined(XR_USE_PLATFORM_WAYLAND)
        // TODO: Just need something other than NULL here for now (for validation).  Eventually need
        //       to correctly put in a valid pointer to an wl_display
        m_graphicsBinding.display = reinterpret_cast<wl_display*>(0xFFFFFFFF);
#elif defined(XR_USE_PLATFORM_MACOS)
#error OpenGL bindings for Mac have not been implemented
#else
#error Platform not supported
#endif

#if !defined(XR_USE_PLATFORM_MACOS)
        glEnable(GL_DEBUG_OUTPUT);
        glDebugMessageCallback(
            [](GLenum source, GLenum type, GLuint id, GLenum severity, GLsizei length, const GLchar* message,
               const void* userParam) {
                ((OpenGLGraphicsPlugin*)userParam)->DebugMessageCallback(source, type, id, severity, length, message);
            },
            this);
#endif  // !defined(XR_USE_PLATFORM_MACOS)

        InitializeResources();
    }